

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O1

char * CmdSplitLine(Abc_Frame_t *pAbc,char *sCommand,int *argc,char ***argv)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  char **ppcVar4;
  bool bVar5;
  bool bVar6;
  uint *__ptr;
  void *pvVar7;
  ushort **ppuVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  char cVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 10;
  __ptr[1] = 0;
  pvVar7 = malloc(0x50);
  *(void **)(__ptr + 2) = pvVar7;
  ppuVar8 = __ctype_b_loc();
LAB_002bf432:
  pcVar13 = sCommand + -1;
  do {
    sCommand = sCommand + 1;
    pcVar15 = pcVar13 + 1;
    pcVar13 = pcVar13 + 1;
  } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar15 * 2 + 1) & 0x20) != 0);
  lVar17 = 0;
  bVar5 = false;
  bVar6 = false;
  do {
    cVar12 = pcVar13[lVar17];
    if ((cVar12 == '#') || (cVar12 == ';')) {
LAB_002bf47d:
      if (!bVar5 && !bVar6) break;
    }
    else {
      if (cVar12 == '\0') break;
      if ((*(byte *)((long)*ppuVar8 + (long)cVar12 * 2 + 1) & 0x20) != 0) goto LAB_002bf47d;
    }
    if (cVar12 == '\'') {
      bVar5 = !bVar5;
    }
    if (cVar12 == '\"') {
      bVar6 = !bVar6;
    }
    lVar17 = lVar17 + 1;
    sCommand = sCommand + 1;
  } while( true );
  if (bVar5 || bVar6) {
    fwrite("** cmd warning: ignoring unbalanced quote ...\n",0x2e,1,(FILE *)pAbc->Err);
  }
  if (lVar17 == 0) {
    *argc = __ptr[1];
    ppcVar4 = *(char ***)(__ptr + 2);
    __ptr[0] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    *argv = ppcVar4;
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (*pcVar13 == '#') {
      pcVar15 = sCommand + -2;
      do {
        pcVar13 = pcVar15 + 1;
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar13;
      } while (*pcVar1 != '\0');
    }
    else if (*pcVar13 == ';') {
      pcVar13 = sCommand;
    }
    return pcVar13;
  }
  pvVar7 = malloc(lVar17 + 1);
  lVar9 = 0;
  if (0 < lVar17) {
    iVar11 = 0;
    do {
      cVar12 = pcVar13[lVar9];
      if ((cVar12 != '\"') && (cVar12 != '\'')) {
        if (((*ppuVar8)[cVar12] >> 0xd & 1) != 0) {
          cVar12 = ' ';
        }
        lVar14 = (long)iVar11;
        iVar11 = iVar11 + 1;
        *(char *)((long)pvVar7 + lVar14) = cVar12;
      }
      lVar9 = lVar9 + 1;
    } while (lVar17 != lVar9);
    lVar9 = (long)iVar11;
  }
  *(undefined1 *)((long)pvVar7 + lVar9) = 0;
  uVar2 = __ptr[1];
  uVar3 = *__ptr;
  if (uVar2 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar10 = malloc(0x80);
      }
      else {
        pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
      }
      uVar16 = 0x10;
    }
    else {
      uVar16 = uVar3 * 2;
      if ((int)uVar16 <= (int)uVar3) goto LAB_002bf592;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar10 = malloc((ulong)uVar3 << 4);
      }
      else {
        pvVar10 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
      }
    }
    *(void **)(__ptr + 2) = pvVar10;
    *__ptr = uVar16;
  }
LAB_002bf592:
  sCommand = pcVar13 + lVar17;
  __ptr[1] = uVar2 + 1;
  *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pvVar7;
  goto LAB_002bf432;
}

Assistant:

const char * CmdSplitLine( Abc_Frame_t * pAbc, const char *sCommand, int *argc, char ***argv )
{
    const char *p, *start;
    char c;
    int i, j;
    char *new_arg;
    Vec_Ptr_t * vArgs;
    int single_quote, double_quote;

    vArgs = Vec_PtrAlloc( 10 );

    p = sCommand;
    for ( ;; )
    {
        // skip leading white space 
        while ( isspace( ( int ) *p ) )
        {
            p++;
        }

        // skip until end of this token 
        single_quote = double_quote = 0;
        for ( start = p; ( c = *p ) != '\0'; p++ )
        {
            if ( c == ';' || c == '#' || isspace( ( int ) c ) )
            {
                if ( !single_quote && !double_quote )
                {
                    break;
                }
            }
            if ( c == '\'' )
            {
                single_quote = !single_quote;
            }
            if ( c == '"' )
            {
                double_quote = !double_quote;
            }
        }
        if ( single_quote || double_quote )
        {
            ( void ) fprintf( pAbc->Err, "** cmd warning: ignoring unbalanced quote ...\n" );
        }
        if ( start == p )
            break;

        new_arg = ABC_ALLOC( char, p - start + 1 );
        j = 0;
        for ( i = 0; i < p - start; i++ )
        {
            c = start[i];
            if ( ( c != '\'' ) && ( c != '\"' ) )
            {
                new_arg[j++] = isspace( ( int ) c ) ? ' ' : start[i];
            }
        }
        new_arg[j] = '\0';
        Vec_PtrPush( vArgs, new_arg );
    }

    *argc = vArgs->nSize;
    *argv = (char **)Vec_PtrReleaseArray( vArgs );
    Vec_PtrFree( vArgs );
    if ( *p == ';' )
    {
        p++;
    }
    else if ( *p == '#' )
    {
        for ( ; *p != 0; p++ ); // skip to end of line 
    }
    return p;
}